

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_gramma.hpp
# Opt level: O0

void __thiscall SwitchStatement::SwitchStatement(SwitchStatement *this)

{
  SwitchStatement *this_local;
  
  AnalysisInterface::AnalysisInterface(&this->super_AnalysisInterface);
  (this->super_AnalysisInterface)._vptr_AnalysisInterface = (_func_int **)&PTR_Parse_0020d738;
  Expression::Expression(&this->m_expression);
  SwitchTable::SwitchTable(&this->m_switch_table);
  Default::Default(&this->m_default);
  std::__cxx11::string::string((string *)&this->m_bottom_label);
  return;
}

Assistant:

void LogOutput() {
        string str("This is a switch loop statement");
        g_log_tools->GrammaNormalLogs(str);
    }